

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLightCfg.c
# Opt level: O0

void XcpLightCfg_readFromAddress(uint8_t *source,uint8_t length,uint8_t *buffer)

{
  uint8_t *local_20;
  uint8_t *buffer_local;
  uint8_t *puStack_10;
  uint8_t length_local;
  uint8_t *source_local;
  
  local_20 = buffer;
  buffer_local._7_1_ = length;
  puStack_10 = source;
  if (source != (uint8_t *)0x0) {
    for (; buffer_local._7_1_ != '\0'; buffer_local._7_1_ = buffer_local._7_1_ + 0xff) {
      *local_20 = *puStack_10;
      local_20 = local_20 + 1;
      puStack_10 = puStack_10 + 1;
    }
  }
  return;
}

Assistant:

void XcpLightCfg_readFromAddress(uint8_t *source, uint8_t length, uint8_t *buffer)
{
  if (source)
  {
    while (length)
    {
      *buffer = (*source);
      buffer++;
      source++;
      length--;
    }
  }
}